

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O3

void GetMinMax(dgBigVector *minOut,dgBigVector *maxOut,HaF64 *vertexArray,HaI32 vCount,
              HaI32 strideInBytes)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  HaF64 *pHVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar14 = strideInBytes >> 3;
  if (iVar14 < 3) {
    __assert_fail("stride >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x38,
                  "void GetMinMax(dgBigVector &, dgBigVector &, const hacd::HaF64 *const, hacd::HaI32, hacd::HaI32)"
                 );
  }
  dVar1 = (double)vertexArray[2];
  if (((!NAN(dVar1)) && ((ulong)ABS(dVar1) < 0x7ff0000000000000)) && (!NAN((double)vertexArray[1])))
  {
    auVar2 = *(undefined1 (*) [16])vertexArray;
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    auVar15 = vpandq_avx512vl(auVar2,auVar15);
    auVar9._8_8_ = 0x7fefffffffffffff;
    auVar9._0_8_ = 0x7fefffffffffffff;
    uVar8 = vpcmpgtq_avx512vl(auVar15,auVar9);
    if (((uVar8 & 1) == 0) && ((uVar8 & 3) >> 1 == 0)) {
      (minOut->super_dgTemplateVector<double>).m_x = (double)auVar2._0_8_;
      (minOut->super_dgTemplateVector<double>).m_y = (double)auVar2._8_8_;
      (minOut->super_dgTemplateVector<double>).m_z = dVar1;
      (minOut->super_dgTemplateVector<double>).m_w = 0.0;
      dVar1 = (double)vertexArray[2];
      if ((!NAN(dVar1)) &&
         (((ulong)ABS(dVar1) < 0x7ff0000000000000 && (!NAN((double)vertexArray[1]))))) {
        auVar2 = *(undefined1 (*) [16])vertexArray;
        auVar10._8_8_ = 0x7fffffffffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar15 = vpandq_avx512vl(auVar2,auVar10);
        auVar11._8_8_ = 0x7fefffffffffffff;
        auVar11._0_8_ = 0x7fefffffffffffff;
        uVar8 = vpcmpgtq_avx512vl(auVar15,auVar11);
        if (((uVar8 & 1) == 0) && ((uVar8 & 3) >> 1 == 0)) {
          (maxOut->super_dgTemplateVector<double>).m_x = (double)auVar2._0_8_;
          (maxOut->super_dgTemplateVector<double>).m_y = (double)auVar2._8_8_;
          (maxOut->super_dgTemplateVector<double>).m_z = dVar1;
          (maxOut->super_dgTemplateVector<double>).m_w = 0.0;
          if (1 < vCount) {
            iVar12 = vCount + -1;
            pHVar13 = vertexArray + (long)iVar14 + 2;
            do {
              auVar16._8_8_ = 0;
              auVar16._0_8_ = pHVar13[-2];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (minOut->super_dgTemplateVector<double>).m_x;
              auVar2 = vminsd_avx(auVar16,auVar2);
              (minOut->super_dgTemplateVector<double>).m_x = auVar2._0_8_;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = pHVar13[-1];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = (minOut->super_dgTemplateVector<double>).m_y;
              auVar2 = vminsd_avx(auVar17,auVar3);
              (minOut->super_dgTemplateVector<double>).m_y = auVar2._0_8_;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *pHVar13;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = (minOut->super_dgTemplateVector<double>).m_z;
              auVar2 = vminsd_avx(auVar18,auVar4);
              (minOut->super_dgTemplateVector<double>).m_z = auVar2._0_8_;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = pHVar13[-2];
              auVar5._8_8_ = 0;
              auVar5._0_8_ = (maxOut->super_dgTemplateVector<double>).m_x;
              auVar2 = vmaxsd_avx(auVar19,auVar5);
              (maxOut->super_dgTemplateVector<double>).m_x = auVar2._0_8_;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = pHVar13[-1];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (maxOut->super_dgTemplateVector<double>).m_y;
              auVar2 = vmaxsd_avx(auVar20,auVar6);
              (maxOut->super_dgTemplateVector<double>).m_y = auVar2._0_8_;
              auVar21._8_8_ = 0;
              auVar21._0_8_ = *pHVar13;
              pHVar13 = pHVar13 + iVar14;
              iVar12 = iVar12 + -1;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = (maxOut->super_dgTemplateVector<double>).m_z;
              auVar2 = vmaxsd_avx(auVar21,auVar7);
              (maxOut->super_dgTemplateVector<double>).m_z = auVar2._0_8_;
            } while (iVar12 != 0);
          }
          return;
        }
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void GetMinMax (dgBigVector &minOut, dgBigVector &maxOut, const hacd::HaF64* const vertexArray, hacd::HaI32 vCount, hacd::HaI32 strideInBytes)
{
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));
	const hacd::HaF64* vArray = vertexArray + stride;

	HACD_ASSERT (stride >= 3);
	minOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 
	maxOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 

	for (hacd::HaI32 i = 1; i < vCount; i ++) {
		minOut.m_x = GetMin (minOut.m_x, vArray[0]);
		minOut.m_y = GetMin (minOut.m_y, vArray[1]);
		minOut.m_z = GetMin (minOut.m_z, vArray[2]);

		maxOut.m_x = GetMax (maxOut.m_x, vArray[0]);
		maxOut.m_y = GetMax (maxOut.m_y, vArray[1]);
		maxOut.m_z = GetMax (maxOut.m_z, vArray[2]);

		vArray += stride;
	}
}